

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O0

void Set_BitGravity(XButtonEvent *event,DspInterface dsp,Window window,int grav)

{
  Window local_30;
  Window OldWindow;
  int grav_local;
  Window window_local;
  DspInterface dsp_local;
  XButtonEvent *event_local;
  
  local_30 = 0;
  switch(dsp->BitGravity) {
  case 1:
    local_30 = dsp->NWGrav;
    break;
  case 3:
    local_30 = dsp->NEGrav;
    break;
  case 7:
    local_30 = dsp->SWGrav;
    break;
  case 9:
    local_30 = dsp->SEGrav;
  }
  dsp->BitGravity = grav;
  XSetWindowBackgroundPixmap(event->display,local_30,dsp->GravityOffPixmap);
  XClearWindow(event->display,local_30);
  XSetWindowBackgroundPixmap(event->display,window,dsp->GravityOnPixmap);
  XClearWindow(event->display,window);
  return;
}

Assistant:

void Set_BitGravity(XButtonEvent *event, DspInterface dsp, Window window, int grav)
{
  Window OldWindow = 0;

  /* Change Background Pixmap of Gravity Window */
  XLOCK;
  switch (dsp->BitGravity) {
    case NorthWestGravity: OldWindow = dsp->NWGrav; break;
    case NorthEastGravity: OldWindow = dsp->NEGrav; break;
    case SouthWestGravity: OldWindow = dsp->SWGrav; break;
    case SouthEastGravity: OldWindow = dsp->SEGrav; break;
  }

  dsp->BitGravity = grav;

  XSetWindowBackgroundPixmap(event->display, OldWindow, dsp->GravityOffPixmap);
  XClearWindow(event->display, OldWindow);

  XSetWindowBackgroundPixmap(event->display, window, dsp->GravityOnPixmap);
  XClearWindow(event->display, window);
  XUNLOCK(dsp);
}